

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void int16_suite::test_endian(void)

{
  undefined4 local_58;
  value local_54 [2];
  undefined4 local_4c;
  type local_48 [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [3];
  
  decoder.current.view._M_str._5_2_ = 0x22b2;
  decoder.current.view._M_str._7_1_ = 0x11;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[3]>
            ((decoder *)local_38,(uchar (*) [3])((long)&decoder.current.view._M_str + 5));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x114,"void int16_suite::test_endian()",local_40,&local_44);
  local_48[0] = trial::protocol::bintoken::detail::decoder::
                value<trial::protocol::bintoken::token::int16>((decoder *)local_38);
  local_4c = 0x1122;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("decoder.value<token::int16>()","0x1122",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x115,"void int16_suite::test_endian()",local_48,&local_4c);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_54[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_58 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x117,"void int16_suite::test_endian()",local_54,&local_58);
  return;
}

Assistant:

void test_endian()
{
    const value_type input[] = { token::code::int16, 0x22, 0x11 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int16>(), 0x1122);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}